

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int op_http_stream_seek(void *_stream,opus_int64 _offset,int _whence)

{
  long lVar1;
  OpusHTTPConn *pOVar2;
  opus_int32 oVar3;
  int iVar4;
  int iVar5;
  bool local_d2;
  bool local_d1;
  long local_d0;
  long local_c0;
  int just_read_ahead;
  int available_1;
  opus_int64 read_ahead_thresh;
  opus_int64 end_pos_1;
  opus_int64 conn_pos_1;
  OpusHTTPConn *pOStack_90;
  int available;
  opus_int64 end_pos;
  opus_int64 conn_pos;
  int ret;
  int ci;
  int pipeline;
  opus_int64 pos;
  opus_int64 content_length;
  OpusHTTPConn **close_pnext;
  OpusHTTPConn *close_conn;
  OpusHTTPConn **pnext;
  OpusHTTPConn *conn;
  OpusHTTPStream *stream;
  op_time seek_time;
  int _whence_local;
  opus_int64 _offset_local;
  void *_stream_local;
  
  if (*(int *)((long)_stream + 0x280) == 0) {
    return -1;
  }
  lVar1 = *(long *)((long)_stream + 0x260);
  iVar4 = *(int *)((long)_stream + 0x27c);
  local_c0 = lVar1;
  if (-1 < iVar4) {
    local_c0 = *(long *)((long)_stream + (long)iVar4 * 0x60);
  }
  if (_whence == 0) {
    _ci = _offset;
    if (_offset < 0) {
      return -1;
    }
  }
  else if (_whence == 1) {
    if ((_offset < -local_c0) || (0x7fffffffffffffff - local_c0 < _offset)) {
      return -1;
    }
    _ci = _offset + local_c0;
  }
  else {
    if (_whence != 2) {
      return -1;
    }
    if ((_offset < -lVar1) || (0x7fffffffffffffff - lVar1 < _offset)) {
      return -1;
    }
    _ci = lVar1 + _offset;
  }
  seek_time.tv_nsec._4_4_ = _whence;
  if (iVar4 < 0) {
    op_time_get((op_time *)&stream);
  }
  else {
    op_http_conn_read_rate_update((OpusHTTPConn *)((long)_stream + (long)iVar4 * 0x60));
    stream = *(OpusHTTPStream **)((long)_stream + (long)iVar4 * 0x60 + 0x30);
    seek_time.tv_sec = *(__time_t *)((long)_stream + (long)iVar4 * 0x60 + 0x38);
  }
  if (_ci < lVar1) {
    close_conn = (OpusHTTPConn *)((long)_stream + 400);
    pnext = *(OpusHTTPConn ***)((long)_stream + 400);
    while (pnext != (OpusHTTPConn **)0x0) {
      oVar3 = op_time_diff_ms((op_time *)&stream,(op_time *)(pnext + 6));
      if ((oVar3 < 0x1389) && (6 < *(int *)((long)pnext + 0x54))) {
        iVar4 = op_http_conn_estimate_available((OpusHTTPConn *)pnext);
        pOStack_90 = pnext[1];
        if (-1 < (long)pnext[2]) {
          pOStack_90 = pnext[3];
        }
        if (((_ci < (long)*pnext) || ((long)iVar4 < _ci - (long)*pnext)) ||
           ((-1 < (long)pOStack_90 && ((long)pOStack_90 <= _ci)))) {
          close_conn = (OpusHTTPConn *)(pnext + 5);
          pnext = (OpusHTTPConn **)pnext[5];
        }
        else {
          iVar4 = op_http_conn_read_ahead((OpusHTTPStream *)_stream,(OpusHTTPConn *)pnext,1,_ci);
          if (-1 < iVar4) {
            close_conn->pos = (opus_int64)pnext[5];
            pnext[5] = *(OpusHTTPConn **)((long)_stream + 400);
            *(OpusHTTPConn ***)((long)_stream + 400) = pnext;
            *(int *)((long)_stream + 0x27c) = (int)(((long)pnext - (long)_stream) / 0x60);
            return 0;
          }
          op_http_conn_close((OpusHTTPStream *)_stream,(OpusHTTPConn *)pnext,
                             (OpusHTTPConn **)close_conn,1);
          pnext = (OpusHTTPConn **)close_conn->pos;
        }
      }
      else {
        op_http_conn_close((OpusHTTPStream *)_stream,(OpusHTTPConn *)pnext,
                           (OpusHTTPConn **)close_conn,1);
        pnext = (OpusHTTPConn **)close_conn->pos;
      }
    }
    content_length = 0;
    close_pnext = (OpusHTTPConn **)0x0;
    close_conn = (OpusHTTPConn *)((long)_stream + 400);
    pnext = *(OpusHTTPConn ***)((long)_stream + 400);
    iVar4 = *(int *)((long)_stream + 0x284);
    while (pnext != (OpusHTTPConn **)0x0) {
      if ((long)*(int *)((long)_stream + 0x290) * (long)pnext[9] >> 0xb < 0x8000) {
        local_d0 = 0x8000;
      }
      else {
        local_d0 = (long)*(int *)((long)_stream + 0x290) * (long)pnext[9] >> 0xb;
      }
      iVar5 = op_http_conn_estimate_available((OpusHTTPConn *)pnext);
      pOVar2 = *pnext;
      read_ahead_thresh = (opus_int64)pnext[1];
      if (-1 < (long)pnext[2]) {
        read_ahead_thresh = (opus_int64)pnext[3];
      }
      local_d1 = false;
      if (((long)pOVar2 <= _ci) &&
         (local_d1 = false, (_ci - (long)pOVar2) - (long)iVar5 <= local_d0)) {
        local_d2 = read_ahead_thresh < 0 || _ci < read_ahead_thresh;
        local_d1 = local_d2;
      }
      if ((local_d1 == 0) &&
         (((iVar4 == 0 || (read_ahead_thresh < 0)) ||
          (local_d0 < (read_ahead_thresh - (long)pOVar2) - (long)iVar5)))) {
        content_length = (opus_int64)close_conn;
        close_pnext = pnext;
        close_conn = (OpusHTTPConn *)(pnext + 5);
        pnext = (OpusHTTPConn **)pnext[5];
      }
      else {
        iVar5 = op_http_conn_read_ahead
                          ((OpusHTTPStream *)_stream,(OpusHTTPConn *)pnext,(uint)local_d1,_ci);
        if (-1 < iVar5) {
          close_conn->pos = (opus_int64)pnext[5];
          pnext[5] = *(OpusHTTPConn **)((long)_stream + 400);
          *(OpusHTTPConn ***)((long)_stream + 400) = pnext;
          *(int *)((long)_stream + 0x27c) = (int)(((long)pnext - (long)_stream) / 0x60);
          return 0;
        }
        op_http_conn_close((OpusHTTPStream *)_stream,(OpusHTTPConn *)pnext,
                           (OpusHTTPConn **)close_conn,1);
        pnext = (OpusHTTPConn **)close_conn->pos;
      }
    }
    if (*(long *)((long)_stream + 0x198) == 0) {
      op_http_conn_close((OpusHTTPStream *)_stream,(OpusHTTPConn *)close_pnext,
                         (OpusHTTPConn **)content_length,1);
    }
    pOVar2 = *(OpusHTTPConn **)((long)_stream + 0x198);
    oVar3 = -1;
    if (iVar4 != 0) {
      oVar3 = 0x8000;
    }
    iVar4 = op_http_conn_open_pos((OpusHTTPStream *)_stream,pOVar2,_ci,oVar3);
    if (iVar4 < 0) {
      op_http_conn_close((OpusHTTPStream *)_stream,pOVar2,(OpusHTTPConn **)((long)_stream + 400),1);
      _stream_local._4_4_ = -1;
    }
    else {
      _stream_local._4_4_ = 0;
    }
  }
  else {
    *(undefined4 *)((long)_stream + 0x27c) = 0xffffffff;
    *(opus_int64 *)((long)_stream + 0x268) = _ci;
    _stream_local._4_4_ = 0;
  }
  return _stream_local._4_4_;
}

Assistant:

static int op_http_stream_seek(void *_stream,opus_int64 _offset,int _whence){
  op_time          seek_time;
  OpusHTTPStream  *stream;
  OpusHTTPConn    *conn;
  OpusHTTPConn   **pnext;
  OpusHTTPConn    *close_conn;
  OpusHTTPConn   **close_pnext;
  opus_int64       content_length;
  opus_int64       pos;
  int              pipeline;
  int              ci;
  int              ret;
  stream=(OpusHTTPStream *)_stream;
  if(!stream->seekable)return -1;
  content_length=stream->content_length;
  /*If we're seekable, we should have gotten a Content-Length.*/
  OP_ASSERT(content_length>=0);
  ci=stream->cur_conni;
  pos=ci<0?content_length:stream->conns[ci].pos;
  switch(_whence){
    case SEEK_SET:{
      /*Check for overflow:*/
      if(_offset<0)return -1;
      pos=_offset;
    }break;
    case SEEK_CUR:{
      /*Check for overflow:*/
      if(_offset<-pos||_offset>OP_INT64_MAX-pos)return -1;
      pos+=_offset;
    }break;
    case SEEK_END:{
      /*Check for overflow:*/
      if(_offset<-content_length||_offset>OP_INT64_MAX-content_length){
        return -1;
      }
      pos=content_length+_offset;
    }break;
    default:return -1;
  }
  /*Mark when we deactivated the active connection.*/
  if(ci>=0){
    op_http_conn_read_rate_update(stream->conns+ci);
    *&seek_time=*&stream->conns[ci].read_time;
  }
  else op_time_get(&seek_time);
  /*If we seeked past the end of the stream, just disable the active
     connection.*/
  if(pos>=content_length){
    stream->cur_conni=-1;
    stream->pos=pos;
    return 0;
  }
  /*First try to find a connection we can use without waiting.*/
  pnext=&stream->lru_head;
  conn=stream->lru_head;
  while(conn!=NULL){
    opus_int64 conn_pos;
    opus_int64 end_pos;
    int        available;
    /*If this connection has been dormant too long or has made too many
       requests, close it.
      This is to prevent us from hitting server limits/firewall timeouts.*/
    if(op_time_diff_ms(&seek_time,&conn->read_time)>
     OP_CONNECTION_IDLE_TIMEOUT_MS
     ||conn->nrequests_left<OP_PIPELINE_MIN_REQUESTS){
      op_http_conn_close(stream,conn,pnext,1);
      conn=*pnext;
      continue;
    }
    available=op_http_conn_estimate_available(conn);
    conn_pos=conn->pos;
    end_pos=conn->end_pos;
    if(conn->next_pos>=0){
      OP_ASSERT(end_pos>=0);
      OP_ASSERT(conn->next_pos==end_pos);
      end_pos=conn->next_end;
    }
    OP_ASSERT(end_pos<0||conn_pos<=end_pos);
    /*Can we quickly read ahead without issuing a new request or waiting for
       any more data?
      If we have an oustanding request, we'll over-estimate the amount of data
       it has available (because we'll count the response headers, too), but
       that probably doesn't matter.*/
    if(conn_pos<=pos&&pos-conn_pos<=available&&(end_pos<0||pos<end_pos)){
      /*Found a suitable connection to re-use.*/
      ret=op_http_conn_read_ahead(stream,conn,1,pos);
      if(OP_UNLIKELY(ret<0)){
        /*The connection might have become stale, so close it and keep going.*/
        op_http_conn_close(stream,conn,pnext,1);
        conn=*pnext;
        continue;
      }
      /*Sucessfully resurrected this connection.*/
      *pnext=conn->next;
      conn->next=stream->lru_head;
      stream->lru_head=conn;
      stream->cur_conni=(int)(conn-stream->conns);
      OP_ASSERT(stream->cur_conni>=0&&stream->cur_conni<OP_NCONNS_MAX);
      return 0;
    }
    pnext=&conn->next;
    conn=conn->next;
  }
  /*Chances are that didn't work, so now try to find one we can use by reading
     ahead a reasonable amount and/or by issuing a new request.*/
  close_pnext=NULL;
  close_conn=NULL;
  pnext=&stream->lru_head;
  conn=stream->lru_head;
  pipeline=stream->pipeline;
  while(conn!=NULL){
    opus_int64 conn_pos;
    opus_int64 end_pos;
    opus_int64 read_ahead_thresh;
    int        available;
    int        just_read_ahead;
    /*Dividing by 2048 instead of 1000 scales this by nearly 1/2, biasing away
       from connection re-use (and roughly compensating for the lag required to
       reopen the TCP window of a connection that's been idle).
      There's no overflow checking here, because it's vanishingly unlikely, and
       all it would do is cause us to make poor decisions.*/
    read_ahead_thresh=OP_MAX(OP_READAHEAD_THRESH_MIN,
     stream->connect_rate*conn->read_rate>>11);
    available=op_http_conn_estimate_available(conn);
    conn_pos=conn->pos;
    end_pos=conn->end_pos;
    if(conn->next_pos>=0){
      OP_ASSERT(end_pos>=0);
      OP_ASSERT(conn->next_pos==end_pos);
      end_pos=conn->next_end;
    }
    OP_ASSERT(end_pos<0||conn_pos<=end_pos);
    /*Can we quickly read ahead without issuing a new request?*/
    just_read_ahead=conn_pos<=pos&&pos-conn_pos-available<=read_ahead_thresh
     &&(end_pos<0||pos<end_pos);
    if(just_read_ahead||pipeline&&end_pos>=0
     &&end_pos-conn_pos-available<=read_ahead_thresh){
      /*Found a suitable connection to re-use.*/
      ret=op_http_conn_read_ahead(stream,conn,just_read_ahead,pos);
      if(OP_UNLIKELY(ret<0)){
        /*The connection might have become stale, so close it and keep going.*/
        op_http_conn_close(stream,conn,pnext,1);
        conn=*pnext;
        continue;
      }
      /*Sucessfully resurrected this connection.*/
      *pnext=conn->next;
      conn->next=stream->lru_head;
      stream->lru_head=conn;
      stream->cur_conni=(int)(conn-stream->conns);
      OP_ASSERT(stream->cur_conni>=0&&stream->cur_conni<OP_NCONNS_MAX);
      return 0;
    }
    close_pnext=pnext;
    close_conn=conn;
    pnext=&conn->next;
    conn=conn->next;
  }
  /*No suitable connections.
    Open a new one.*/
  if(stream->free_head==NULL){
    /*All connections in use.
      Expire one of them (we should have already picked which one when scanning
       the list).*/
    OP_ASSERT(close_conn!=NULL);
    OP_ASSERT(close_pnext!=NULL);
    op_http_conn_close(stream,close_conn,close_pnext,1);
  }
  OP_ASSERT(stream->free_head!=NULL);
  conn=stream->free_head;
  /*If we can pipeline, only request a chunk of data.
    If we're seeking now, there's a good chance we will want to seek again
     soon, and this avoids committing this connection to reading the rest of
     the stream.
    Particularly with SSL or proxies, issuing a new request on the same
     connection can be substantially faster than opening a new one.
    This also limits the amount of data the server will blast at us on this
     connection if we later seek elsewhere and start reading from a different
     connection.*/
  ret=op_http_conn_open_pos(stream,conn,pos,
   pipeline?OP_PIPELINE_CHUNK_SIZE:-1);
  if(OP_UNLIKELY(ret<0)){
    op_http_conn_close(stream,conn,&stream->lru_head,1);
    return -1;
  }
  return 0;
}